

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::AddProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,bool throwIfNotExtensible,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  ushort uVar2;
  int iVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  JavascriptLibrary *library;
  code *pcVar5;
  DictionaryPropertyDescriptor<unsigned_short> *this_00;
  Var pvVar6;
  ScriptContext *this_01;
  bool bVar7;
  bool bVar8;
  PropertyTypes PVar9;
  BOOL BVar10;
  PropertyId propertyId;
  undefined4 *puVar11;
  BigDictionaryTypeHandler *this_02;
  PropertyAttributes PVar12;
  undefined7 in_register_00000081;
  PropertyRecord *pPVar13;
  DynamicObject *pDVar14;
  DictionaryPropertyDescriptor<unsigned_short> *local_78;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  Var local_68;
  ScriptContext *local_60;
  PropertyValueInfo *local_58;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<unsigned_short> local_40;
  DictionaryPropertyDescriptor<unsigned_short> newDescriptor;
  
  newDescriptor._4_4_ = SUB84(CONCAT71(in_register_00000081,attributes),0);
  local_58 = info;
  local_50 = propertyRecord;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x862,"(instance)","instance");
    if (!bVar7) goto LAB_00db365f;
    *puVar11 = 0;
  }
  local_60 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  newDescriptor._0_4_ = local_50->pid;
  bVar7 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_50,&local_78,(int *)&local_40);
  if (bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x868,
                                "(!propertyMap->TryGetReference(propertyRecord, &descriptor))",
                                "!propertyMap->TryGetReference(propertyRecord, &descriptor)");
    if (!bVar7) goto LAB_00db365f;
    *puVar11 = 0;
  }
  if (local_50->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x869,"(!propertyRecord->IsNumeric())",
                                "!propertyRecord->IsNumeric()");
    if (!bVar7) goto LAB_00db365f;
    *puVar11 = 0;
  }
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar7 = DynamicTypeHandler::VerifyIsExtensible
                        (&this->super_DynamicTypeHandler,local_60,throwIfNotExtensible), !bVar7)) {
    return 0;
  }
  iVar3 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar3 <= (int)(uint)this->nextPropertyIndex) {
    if ((0xfffd < iVar3) || (_DAT_015d6340 <= iVar3)) {
      this_02 = ConvertToBigDictionaryTypeHandler(this,instance);
      BVar10 = DictionaryTypeHandlerBase<int>::AddProperty
                         (this_02,instance,local_50,value,(PropertyAttributes)newDescriptor.Getter,
                          local_58,flags,false,possibleSideEffects);
      return BVar10;
    }
    EnsureSlotCapacity(this,instance,1);
  }
  uVar2 = this->nextPropertyIndex;
  if (uVar2 == 0xffff) {
    ::Math::DefaultOverflowPolicy();
  }
  this->nextPropertyIndex = uVar2 + 1;
  local_40.flags = PreventFalseReference;
  local_40.Attributes = (PropertyAttributes)newDescriptor.Getter;
  local_40.Getter = 0xffff;
  local_40.Setter = 0xffff;
  propertyRecord_local = (PropertyRecord *)instance;
  local_40.Data = uVar2;
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x884,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar7) goto LAB_00db365f;
    *puVar11 = 0;
  }
  pRVar4 = (this->singletonInstance).ptr;
  if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    pPVar13 = (PropertyRecord *)0x0;
  }
  else {
    pPVar13 = (PropertyRecord *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
  }
  local_68 = value;
  if (pPVar13 != propertyRecord_local && pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x887,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar7) goto LAB_00db365f;
    *puVar11 = 0;
  }
  pvVar6 = local_68;
  pDVar14 = (DynamicObject *)propertyRecord_local;
  if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
      (local_40.flags = local_40.flags | IsInitialized, pPVar13 == propertyRecord_local)) &&
     ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
      PropertyOperation_None && 0xf < (uint)newDescriptor._0_4_)) {
    if (local_68 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x88f,"(value != nullptr)","value != nullptr");
      if (!bVar7) goto LAB_00db365f;
      *puVar11 = 0;
    }
    pDVar14 = (DynamicObject *)propertyRecord_local;
    BVar10 = RecyclableObject::IsExternal((RecyclableObject *)propertyRecord_local);
    if (BVar10 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x891,"(!instance->IsExternal())","!instance->IsExternal()");
      if (!bVar7) {
LAB_00db365f:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
      pDVar14 = (DynamicObject *)propertyRecord_local;
    }
    bVar7 = VarIs<Js::JavascriptFunction>(pvVar6);
    if (bVar7) {
      bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
      bVar8 = !bVar8;
    }
    else {
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
      bVar8 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                        ((DynamicObject *)propertyRecord_local,local_50,pvVar6);
      bVar8 = bVar8 && !bVar7;
      pDVar14 = (DynamicObject *)propertyRecord_local;
    }
    local_40.flags = bVar8 << 5 | local_40.flags & ~IsFixed;
  }
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_50,&local_40);
  if ((newDescriptor._4_4_ & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(pDVar14,false);
  }
  library = (local_60->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&descriptor);
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
               &library->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
  this_00 = descriptor;
  if (((newDescriptor._4_4_ & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
     this_01 = local_60, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(local_60,newDescriptor._0_4_);
    ScriptContext::InvalidateStoreFieldCaches(this_01,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)this_00);
  }
  bVar7 = NoSpecialPropertyCache::IsSpecialProperty(newDescriptor._0_4_);
  pDVar14 = (DynamicObject *)propertyRecord_local;
  if ((bVar7) &&
     (PVar9 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler),
     -1 < (char)PVar9)) {
    bVar7 = NoSpecialPropertyCache::IsDefaultSpecialProperty(pDVar14,library,newDescriptor._0_4_);
    if (bVar7) {
      if (local_58 != (PropertyValueInfo *)0x0) {
        local_58->m_instance = &pDVar14->super_RecyclableObject;
        local_58->m_propertyIndex = 0xffff;
        local_58->m_attributes = '\0';
        local_58->flags = InlineCacheNoFlags;
      }
    }
    else {
      pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes;
      *pTVar1 = *pTVar1 | 0x80;
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        Memory::Recycler::WBSetBit((char *)&descriptor);
        descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                     &library->typesWithNoSpecialPropertyProtoChain;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
        pDVar14 = (DynamicObject *)propertyRecord_local;
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                  ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)descriptor);
      }
    }
  }
  pvVar6 = local_68;
  DynamicTypeHandler::SetSlotUnchecked(pDVar14,(uint)uVar2,local_68);
  if (local_58 != (PropertyValueInfo *)0x0) {
    PVar12 = (PropertyAttributes)newDescriptor.Getter;
    if ((local_40.flags & IsFixed) != None) {
      PVar12 = '\0';
    }
    local_58->m_instance = &pDVar14->super_RecyclableObject;
    local_58->m_propertyIndex = -(ushort)((local_40.flags & IsFixed) != None) | uVar2;
    local_58->m_attributes = PVar12;
    local_58->flags = InlineCacheNoFlags;
  }
  ScriptContext::InvalidateProtoCaches(local_60,local_50->pid);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,pDVar14,local_50->pid,pvVar6,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::AddProperty(DynamicObject* instance, const PropertyRecord* propertyRecord, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, bool throwIfNotExtensible, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        PropertyId propertyId = propertyRecord->GetPropertyId();
#if DBG
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(!propertyMap->TryGetReference(propertyRecord, &descriptor));
        Assert(!propertyRecord->IsNumeric());
#endif

        if (!isForce)
        {
            if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
            {
                return FALSE;
            }
        }

        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize ||
                (this->GetSlotCapacity() >= CONFIG_FLAG(BigDictionaryTypeHandlerThreshold) && !this->IsBigDictionaryTypeHandler()))
            {
                BigDictionaryTypeHandler* newTypeHandler = ConvertToBigDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyRecord, value, attributes, info, flags, false, possibleSideEffects);
            }
            this->EnsureSlotCapacity(instance);
        }

        T index = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(index, attributes);

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

        if ((flags & PropertyOperation_PreInit) == 0)
        {
            newDescriptor.SetIsInitialized(true);
            if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
            {
                Assert(value != nullptr);
                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                Assert(!instance->IsExternal());
                newDescriptor.SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() & CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }
        JavascriptLibrary* library = scriptContext->GetLibrary();

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        if (NoSpecialPropertyCache::IsSpecialProperty(propertyId) && !this->GetHasSpecialProperties())
        {
            if (!NoSpecialPropertyCache::IsDefaultSpecialProperty(instance, library, propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        SetSlotUnchecked(instance, index, value);

#if ENABLE_FIXED_FIELDS
        // If we just added a fixed method, don't populate the inline cache so that we always take the
        // slow path when overwriting this property and correctly invalidate any JIT-ed code that hard-coded
        // this method.
        if (newDescriptor.GetIsFixed())
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }
        else
#endif
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }

        // Always invalidate prototype caches when we add a property.  Previously, we only did this if the current
        // type is used as a prototype, or if the new property is also found on the prototype chain (because
        // adding a new field doesn't create a new dictionary type).  However, if the new property is already in
        // the cache as a missing property, we have to invalidate the prototype caches.
        scriptContext->InvalidateProtoCaches(propertyRecord->GetPropertyId());

        SetPropertyUpdateSideEffect(instance, propertyRecord->GetPropertyId(), value, possibleSideEffects);
        return true;
    }